

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O1

bool __thiscall
UdpSocketImpl::RemoveFromMulticastGroup
          (UdpSocketImpl *this,char *szMulticastIp,char *szInterfaceIp,uint32_t nInterfaceIndex)

{
  int iVar1;
  int *piVar2;
  int __optname;
  int __level;
  uint32_t AnyAddr;
  addrinfo *lstAddr;
  ipv6_mreq mreq;
  undefined4 local_54;
  addrinfo *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  uint32_t local_38;
  
  iVar1 = getaddrinfo(szMulticastIp,(char *)0x0,(addrinfo *)0x0,&local_50);
  if (iVar1 != 0) {
    return false;
  }
  iVar1 = local_50->ai_family;
  freeaddrinfo(local_50);
  local_54 = 0;
  if (iVar1 == 10) {
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    inet_pton(10,szMulticastIp,&local_48);
    local_38 = nInterfaceIndex;
    iVar1 = setsockopt((this->super_BaseSocketImpl).m_fSock,0x29,0x15,&local_48,0x14);
    if (iVar1 != 0) goto LAB_0011d9d0;
    iVar1 = (this->super_BaseSocketImpl).m_fSock;
    __level = 0x29;
    __optname = 0x11;
  }
  else {
    local_48 = 0;
    inet_pton(2,szMulticastIp,&local_48);
    inet_pton(2,szInterfaceIp,(void *)((long)&local_48 + 4));
    iVar1 = setsockopt((this->super_BaseSocketImpl).m_fSock,0,0x24,&local_48,8);
    if (iVar1 != 0) goto LAB_0011d9d0;
    iVar1 = (this->super_BaseSocketImpl).m_fSock;
    __level = 0;
    __optname = 0x20;
  }
  iVar1 = setsockopt(iVar1,__level,__optname,&local_54,4);
  if (iVar1 == 0) {
    return true;
  }
LAB_0011d9d0:
  piVar2 = __errno_location();
  (this->super_BaseSocketImpl).m_iError = *piVar2;
  (this->super_BaseSocketImpl).m_iErrLoc = 3;
  return false;
}

Assistant:

bool UdpSocketImpl::RemoveFromMulticastGroup(const char* const szMulticastIp, const char* const szInterfaceIp, uint32_t nInterfaceIndex) noexcept
#endif
{
    struct addrinfo *lstAddr;
    if (::getaddrinfo(szMulticastIp, nullptr, nullptr, &lstAddr) != 0)
        return false;
    const int iAddFamily = lstAddr->ai_family;
    ::freeaddrinfo(lstAddr);

    constexpr uint32_t AnyAddr = INADDR_ANY;

    if (iAddFamily == AF_INET6)
    {
        ipv6_mreq mreq{IN6ADDR_ANY_INIT, 0};
        inet_pton(AF_INET6, szMulticastIp, &mreq.ipv6mr_multiaddr);
        mreq.ipv6mr_interface = nInterfaceIndex; // use default

        if (::setsockopt(m_fSock, IPPROTO_IPV6, IPV6_DROP_MEMBERSHIP, reinterpret_cast<char*>(&mreq), sizeof(mreq)) != 0
        || ::setsockopt(m_fSock, IPPROTO_IPV6, IPV6_MULTICAST_IF, reinterpret_cast<const char*>(&AnyAddr), sizeof(uint32_t)) != 0)
        {
            m_iError = WSAGetLastError();
            m_iErrLoc = 3;
            return false;
        }
    }
    else
    {
        ip_mreq mreq{{0},{0}};
        inet_pton(AF_INET, szMulticastIp, &mreq.imr_multiaddr.s_addr);
#if defined(_WIN32) || defined(_WIN64)
        mreq.imr_interface.s_addr = htonl(nInterfaceIndex);
#else
        inet_pton(AF_INET, szInterfaceIp, &mreq.imr_interface.s_addr);
#endif

        if (setsockopt(m_fSock, IPPROTO_IP, IP_DROP_MEMBERSHIP, reinterpret_cast<char *>(&mreq), sizeof(mreq)) != 0
        || ::setsockopt(m_fSock, IPPROTO_IP, IP_MULTICAST_IF, reinterpret_cast<const char*>(&AnyAddr), sizeof(uint32_t)) != 0)
        {
            m_iError = WSAGetLastError();
            m_iErrLoc = 3;
            return false;
        }
    }

    return true;
}